

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *v,MOJOSHADER_glShader *p)

{
  int iVar1;
  HashTable *pHVar2;
  undefined8 *key;
  BoundShaders *item;
  void *val;
  BoundShaders shaders;
  MOJOSHADER_glProgram *program;
  MOJOSHADER_glShader *p_local;
  MOJOSHADER_glShader *v_local;
  
  if ((v == (MOJOSHADER_glShader *)0x0) && (p == (MOJOSHADER_glShader *)0x0)) {
    MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
    return;
  }
  if (ctx->linker_cache == (HashTable *)0x0) {
    pHVar2 = hash_create((void *)0x0,hash_shaders,match_shaders,nuke_shaders,0,ctx->malloc_fn,
                         ctx->free_fn,ctx->malloc_data);
    ctx->linker_cache = pHVar2;
    if (ctx->linker_cache == (HashTable *)0x0) {
      out_of_memory();
      return;
    }
  }
  shaders.fragment = (MOJOSHADER_glShader *)0x0;
  item = (BoundShaders *)0x0;
  val = v;
  shaders.vertex = p;
  iVar1 = hash_find(ctx->linker_cache,&val,&item);
  if (iVar1 == 0) {
    shaders.fragment = (MOJOSHADER_glShader *)MOJOSHADER_glLinkProgram(v,p);
    if ((MOJOSHADER_glProgram *)shaders.fragment == (MOJOSHADER_glProgram *)0x0) {
      return;
    }
    key = (undefined8 *)Malloc(0x10);
    if (key == (undefined8 *)0x0) {
      MOJOSHADER_glDeleteProgram((MOJOSHADER_glProgram *)shaders.fragment);
      return;
    }
    *key = val;
    key[1] = shaders.vertex;
    iVar1 = hash_insert(ctx->linker_cache,key,shaders.fragment);
    if (iVar1 != 1) {
      Free(key);
      MOJOSHADER_glDeleteProgram((MOJOSHADER_glProgram *)shaders.fragment);
      out_of_memory();
      return;
    }
  }
  else {
    shaders.fragment = (MOJOSHADER_glShader *)item;
  }
  if (shaders.fragment != (MOJOSHADER_glShader *)0x0) {
    MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)shaders.fragment);
    return;
  }
  __assert_fail("program != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                ,0x83d,"void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *, MOJOSHADER_glShader *)"
               );
}

Assistant:

void MOJOSHADER_glBindShaders(MOJOSHADER_glShader *v, MOJOSHADER_glShader *p)
{
    if ((v == NULL) && (p == NULL))
    {
        MOJOSHADER_glBindProgram(NULL);
        return;
    } // if

    // !!! FIXME: eventually support GL_EXT_separate_shader_objects.
    if (ctx->linker_cache == NULL)
    {
        ctx->linker_cache = hash_create(NULL, hash_shaders, match_shaders,
                                        nuke_shaders, 0, ctx->malloc_fn,
                                        ctx->free_fn, ctx->malloc_data);

        if (ctx->linker_cache == NULL)
        {
            out_of_memory();
            return;
        } // if
    } // if

    MOJOSHADER_glProgram *program = NULL;
    BoundShaders shaders;
    shaders.vertex = v;
    shaders.fragment = p;

    const void *val = NULL;
    if (hash_find(ctx->linker_cache, &shaders, &val))
        program = (MOJOSHADER_glProgram *) val;
    else
    {
        program = MOJOSHADER_glLinkProgram(v, p);
        if (program == NULL)
            return;

        BoundShaders *item = (BoundShaders *) Malloc(sizeof (BoundShaders));
        if (item == NULL)
        {
            MOJOSHADER_glDeleteProgram(program);
            return;
        } // if

        memcpy(item, &shaders, sizeof (BoundShaders));
        if (hash_insert(ctx->linker_cache, item, program) != 1)
        {
            Free(item);
            MOJOSHADER_glDeleteProgram(program);
            out_of_memory();
            return;
        } // if
    } // else

    assert(program != NULL);
    MOJOSHADER_glBindProgram(program);
}